

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resCore.c
# Opt level: O0

int Abc_NtkResynthesize(Abc_Ntk_t *pNtk,Res_Par_t *pPars)

{
  Res_Win_t *p_00;
  Res_Sim_t *p_01;
  Hop_Obj_t *pObj_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  abctime aVar8;
  abctime aVar9;
  Abc_Ntk_t *pAVar10;
  int *piVar11;
  Vec_Ptr_t *vFanins_00;
  abctime aVar12;
  Hop_Obj_t *local_b8;
  abctime clkTotal;
  abctime clk;
  int nFaninsMax;
  int nFanins;
  int nNodesOld;
  int RetValue;
  int k;
  int i;
  uint *puTruth;
  Vec_Ptr_t *vFanins;
  Kit_Graph_t *pGraph;
  Hop_Obj_t *pFunc;
  Abc_Obj_t *pObj;
  Res_Man_t *p;
  ProgressBar *pProgress;
  Res_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  pProgress = (ProgressBar *)pPars;
  pPars_local = (Res_Par_t *)pNtk;
  aVar8 = Abc_Clock();
  pObj = (Abc_Obj_t *)Res_ManAlloc((Res_Par_t *)pProgress);
  iVar1 = Abc_NtkGetTotalFanins((Abc_Ntk_t *)pPars_local);
  pObj[1].vFanouts.nSize = iVar1;
  iVar1 = Abc_NtkNodeNum((Abc_Ntk_t *)pPars_local);
  *(int *)&pObj[1].vFanouts.pArray = iVar1;
  clk._0_4_ = Abc_NtkGetFaninMax((Abc_Ntk_t *)pPars_local);
  if (8 < (int)clk) {
    clk._0_4_ = 8;
  }
  Abc_NtkSweep((Abc_Ntk_t *)pPars_local,0);
  iVar1 = Abc_NtkToAig((Abc_Ntk_t *)pPars_local);
  if (iVar1 == 0) {
    fprintf(_stdout,"Converting to BDD has failed.\n");
    Res_ManFree((Res_Man_t *)pObj);
    pNtk_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_NtkHasAig((Abc_Ntk_t *)pPars_local);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkHasAig(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                    ,0xf3,"int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
    }
    Abc_NtkLevel((Abc_Ntk_t *)pPars_local);
    Abc_NtkStartReverseLevels((Abc_Ntk_t *)pPars_local,pProgress->nItemsTotal);
    iVar1 = Abc_NtkObjNumMax((Abc_Ntk_t *)pPars_local);
    p = (Res_Man_t *)Extra_ProgressBarStart((FILE *)_stdout,iVar1);
    for (RetValue = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(pPars_local + 1)), RetValue < iVar2;
        RetValue = RetValue + 1) {
      pFunc = (Hop_Obj_t *)Abc_NtkObj((Abc_Ntk_t *)pPars_local,RetValue);
      if ((Abc_Obj_t *)pFunc != (Abc_Obj_t *)0x0) {
        Extra_ProgressBarUpdate((ProgressBar *)p,RetValue,(char *)0x0);
        iVar2 = Abc_ObjIsNode((Abc_Obj_t *)pFunc);
        if ((iVar2 != 0) && (iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)pFunc), iVar2 < 9)) {
          if (iVar1 < *(int *)&pFunc->pFanin0) break;
          aVar12 = Abc_Clock();
          iVar2 = Res_WinCompute((Abc_Obj_t *)pFunc,(int)pObj->pNtk->ntkType / 10,
                                 (int)pObj->pNtk->ntkType % 10,(Res_Win_t *)pObj->pNext);
          aVar9 = Abc_Clock();
          pObj[1].field_6.pTemp = (void *)((aVar9 - aVar12) + (long)pObj[1].field_6.pTemp);
          if (iVar2 != 0) {
            iVar2 = Res_WinIsTrivial((Res_Win_t *)pObj->pNext);
            *(int *)&pObj[1].field_0x14 = iVar2 + *(int *)&pObj[1].field_0x14;
            if (*(int *)((long)&pObj->pNtk->pManName + 4) != 0) {
              printf("%5d (lev=%2d) : ",(ulong)*(uint *)&pFunc->pFanin0,
                     (ulong)(*(uint *)((long)&pFunc->pFanin0 + 4) >> 0xc));
              uVar3 = Vec_PtrSize((Vec_Ptr_t *)(pObj->pNext->vFanouts).pArray);
              uVar4 = Vec_PtrSize((Vec_Ptr_t *)(pObj->pNext->field_5).pData);
              uVar5 = Vec_PtrSize((Vec_Ptr_t *)(pObj->pNext->field_6).pCopy);
              uVar6 = Vec_PtrSize(*(Vec_Ptr_t **)&pObj->pNext->vFanouts);
              printf("Win = %3d/%3d/%4d/%3d   ",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6)
              ;
            }
            aVar12 = Abc_Clock();
            p_00 = (Res_Win_t *)pObj->pNext;
            iVar2 = Abc_ObjRequiredLevel((Abc_Obj_t *)pFunc);
            Res_WinDivisors(p_00,iVar2 + -1);
            aVar9 = Abc_Clock();
            pObj[2].pNtk = (Abc_Ntk_t *)((aVar9 - aVar12) + (long)pObj[2].pNtk);
            *(int *)&pObj[1].pNext = *(int *)&pObj[1].pNext + 1;
            iVar2 = Vec_PtrSize((Vec_Ptr_t *)(pObj->pNext->field_6).pCopy);
            *(int *)((long)&pObj[1].pNext + 4) = iVar2 + *(int *)((long)&pObj[1].pNext + 4);
            iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj->pNext[1].pNtk);
            pObj[1].Id = iVar2 + pObj[1].Id;
            if (*(int *)((long)&pObj->pNtk->pManName + 4) != 0) {
              uVar3 = Vec_PtrSize((Vec_Ptr_t *)pObj->pNext[1].pNtk);
              printf("D = %3d ",(ulong)uVar3);
              printf("D+ = %3d ",(ulong)*(uint *)((long)&(pObj->pNext->vFanins).pArray + 4));
            }
            aVar12 = Abc_Clock();
            if (*(long *)&pObj->Id != 0) {
              Abc_NtkDelete(*(Abc_Ntk_t **)&pObj->Id);
            }
            pAVar10 = Res_WndStrash((Res_Win_t *)pObj->pNext);
            *(Abc_Ntk_t **)&pObj->Id = pAVar10;
            aVar9 = Abc_Clock();
            pObj[2].pNext = (Abc_Obj_t *)((aVar9 - aVar12) + (long)pObj[2].pNext);
            if (*(int *)((long)&pObj->pNtk->pManName + 4) != 0) {
              uVar3 = Abc_NtkNodeNum(*(Abc_Ntk_t **)&pObj->Id);
              printf("AIG = %4d ",(ulong)uVar3);
              printf("\n");
            }
            aVar12 = Abc_Clock();
            p_01 = *(Res_Sim_t **)&pObj->vFanins;
            pAVar10 = *(Abc_Ntk_t **)&pObj->Id;
            iVar2 = Vec_PtrSize((Vec_Ptr_t *)(pObj->pNext->vFanouts).pArray);
            iVar2 = Res_SimPrepare(p_01,pAVar10,iVar2,0);
            aVar9 = Abc_Clock();
            *(abctime *)&pObj[2].Id = (aVar9 - aVar12) + *(long *)&pObj[2].Id;
            if (iVar2 == 0) {
              pObj[1].vFanouts.nCap = pObj[1].vFanouts.nCap + 1;
            }
            else if ((*(int *)(*(long *)&pObj->vFanins + 0xc) == 0) &&
                    (*(int *)(*(long *)&pObj->vFanins + 0x10) == 0)) {
              aVar12 = Abc_Clock();
              if (*(int *)&pObj->pNtk->pSpec == 0) {
                nFanins = Res_FilterCandidates
                                    ((Res_Win_t *)pObj->pNext,*(Abc_Ntk_t **)&pObj->Id,
                                     *(Res_Sim_t **)&pObj->vFanins,
                                     (Vec_Vec_t *)(pObj->field_5).pData,
                                     (Vec_Vec_t *)(pObj->field_6).pCopy,(int)clk,0);
              }
              else {
                nFanins = Res_FilterCandidates
                                    ((Res_Win_t *)pObj->pNext,*(Abc_Ntk_t **)&pObj->Id,
                                     *(Res_Sim_t **)&pObj->vFanins,
                                     (Vec_Vec_t *)(pObj->field_5).pData,
                                     (Vec_Vec_t *)(pObj->field_6).pCopy,(int)clk,1);
              }
              aVar9 = Abc_Clock();
              *(abctime *)&pObj[2].vFanins = (aVar9 - aVar12) + *(long *)&pObj[2].vFanins;
              *(int *)&pObj[1].vFanins.pArray = nFanins + *(int *)&pObj[1].vFanins.pArray;
              if (nFanins != 0) {
                pObj[1].vFanins.nCap = pObj[1].vFanins.nCap + 1;
                for (nNodesOld = 0; iVar2 = Vec_VecSize((Vec_Vec_t *)(pObj->field_5).pData),
                    nNodesOld < iVar2; nNodesOld = nNodesOld + 1) {
                  puTruth = (uint *)Vec_VecEntry((Vec_Vec_t *)(pObj->field_5).pData,nNodesOld);
                  iVar2 = Vec_PtrSize((Vec_Ptr_t *)puTruth);
                  if (iVar2 == 0) break;
                  aVar12 = Abc_Clock();
                  if ((pObj->vFanins).pArray != (int *)0x0) {
                    Sto_ManFree((Sto_Man_t *)(pObj->vFanins).pArray);
                  }
                  piVar11 = (int *)Res_SatProveUnsat(*(Abc_Ntk_t **)&pObj->Id,(Vec_Ptr_t *)puTruth);
                  (pObj->vFanins).pArray = piVar11;
                  if ((pObj->vFanins).pArray == (int *)0x0) {
                    aVar9 = Abc_Clock();
                    *(abctime *)&pObj[2].vFanouts = (aVar9 - aVar12) + *(long *)&pObj[2].vFanouts;
                  }
                  else {
                    aVar9 = Abc_Clock();
                    pObj[2].vFanouts.pArray =
                         (int *)((aVar9 - aVar12) + (long)pObj[2].vFanouts.pArray);
                    *(int *)((long)&pObj[1].vFanins.pArray + 4) =
                         *(int *)((long)&pObj[1].vFanins.pArray + 4) + 1;
                    aVar12 = Abc_Clock();
                    iVar2 = Int_ManInterpolate(*(Int_Man_t **)&pObj->vFanouts,
                                               (Sto_Man_t *)(pObj->vFanins).pArray,0,(uint **)&k);
                    aVar9 = Abc_Clock();
                    pObj[2].field_6.pTemp = (void *)((aVar9 - aVar12) + (long)pObj[2].field_6.pTemp)
                    ;
                    iVar7 = Vec_PtrSize((Vec_Ptr_t *)puTruth);
                    if (iVar2 == iVar7 + -2) {
                      if (_k == (uint *)0x0) {
                        __assert_fail("puTruth",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                                      ,0x17c,"int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
                      }
                      vFanins = (Vec_Ptr_t *)
                                Kit_TruthToGraph(_k,iVar2,(Vec_Int_t *)(pObj->vFanouts).pArray);
                      pGraph = (Kit_Graph_t *)
                               Kit_GraphToHop(*(Hop_Man_t **)(pPars_local + 8),
                                              (Kit_Graph_t *)vFanins);
                      Kit_GraphFree((Kit_Graph_t *)vFanins);
                      aVar12 = Abc_Clock();
                      pObj_00 = pFunc;
                      vFanins_00 = Vec_VecEntry((Vec_Vec_t *)(pObj->field_6).pCopy,nNodesOld);
                      Res_UpdateNetwork((Abc_Obj_t *)pObj_00,vFanins_00,(Hop_Obj_t *)pGraph,
                                        (Vec_Vec_t *)pObj[1].pNtk);
                      aVar9 = Abc_Clock();
                      pObj[3].pNtk = (Abc_Ntk_t *)((aVar9 - aVar12) + (long)pObj[3].pNtk);
                      break;
                    }
                  }
                }
              }
            }
            else {
              pObj[1].vFanins.nSize = pObj[1].vFanins.nSize + 1;
              if (*(int *)(*(long *)&pObj->vFanins + 0x10) == 0) {
                local_b8 = Hop_ManConst0(*(Hop_Man_t **)(pPars_local + 8));
              }
              else {
                local_b8 = Hop_ManConst1(*(Hop_Man_t **)(pPars_local + 8));
              }
              pGraph = (Kit_Graph_t *)local_b8;
              puTruth = (uint *)Vec_VecEntry((Vec_Vec_t *)(pObj->field_6).pCopy,0);
              Vec_PtrClear((Vec_Ptr_t *)puTruth);
              Res_UpdateNetwork((Abc_Obj_t *)pFunc,(Vec_Ptr_t *)puTruth,(Hop_Obj_t *)pGraph,
                                (Vec_Vec_t *)pObj[1].pNtk);
            }
          }
        }
      }
    }
    Extra_ProgressBarStop((ProgressBar *)p);
    Abc_NtkStopReverseLevels((Abc_Ntk_t *)pPars_local);
    pObj[2].field_5.pData =
         (void *)(*(long *)(*(long *)&pObj->vFanins + 0x60) + (long)pObj[2].field_5.pData);
    pObj[2].vFanins.pArray =
         (int *)(*(long *)&pObj[2].vFanouts + (long)pObj[2].vFanouts.pArray +
                (long)pObj[2].field_5.pData);
    iVar1 = Abc_NtkGetTotalFanins((Abc_Ntk_t *)pPars_local);
    *(int *)((long)&pObj[1].vFanouts.pArray + 4) = iVar1;
    iVar1 = Abc_NtkNodeNum((Abc_Ntk_t *)pPars_local);
    pObj[1].field_5.iData = iVar1;
    aVar12 = Abc_Clock();
    pObj[3].pNext = (Abc_Obj_t *)(aVar12 - aVar8);
    Res_ManFree((Res_Man_t *)pObj);
    aVar12 = Abc_Clock();
    s_ResynTime = (aVar12 - aVar8) + s_ResynTime;
    iVar1 = Abc_NtkCheck((Abc_Ntk_t *)pPars_local);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkResynthesize(): Network check has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      pNtk_local._4_4_ = 1;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkResynthesize( Abc_Ntk_t * pNtk, Res_Par_t * pPars )
{
    ProgressBar * pProgress;
    Res_Man_t * p;
    Abc_Obj_t * pObj;
    Hop_Obj_t * pFunc;
    Kit_Graph_t * pGraph;
    Vec_Ptr_t * vFanins;
    unsigned * puTruth;
    int i, k, RetValue, nNodesOld, nFanins, nFaninsMax;
    abctime clk, clkTotal = Abc_Clock();

    // start the manager
    p = Res_ManAlloc( pPars );
    p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    nFaninsMax = Abc_NtkGetFaninMax(pNtk);
    if ( nFaninsMax > 8 )
        nFaninsMax = 8;

    // perform the network sweep
    Abc_NtkSweep( pNtk, 0 );

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        Res_ManFree( p );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // try resynthesizing nodes in the topological order
    nNodesOld = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodesOld );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( !Abc_ObjIsNode(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pObj) > 8 )
            continue;
        if ( pObj->Id > nNodesOld )
            break;

        // create the window for this node
clk = Abc_Clock();
        RetValue = Res_WinCompute( pObj, p->pPars->nWindow/10, p->pPars->nWindow%10, p->pWin );
p->timeWin += Abc_Clock() - clk;
        if ( !RetValue )
            continue;
        p->nWinsTriv += Res_WinIsTrivial( p->pWin );

        if ( p->pPars->fVeryVerbose )
        {
            printf( "%5d (lev=%2d) : ", pObj->Id, pObj->Level );
            printf( "Win = %3d/%3d/%4d/%3d   ", 
                Vec_PtrSize(p->pWin->vLeaves), 
                Vec_PtrSize(p->pWin->vBranches),
                Vec_PtrSize(p->pWin->vNodes), 
                Vec_PtrSize(p->pWin->vRoots) );
        }

        // collect the divisors
clk = Abc_Clock();
        Res_WinDivisors( p->pWin, Abc_ObjRequiredLevel(pObj) - 1 );
p->timeDiv += Abc_Clock() - clk;

        p->nWins++;
        p->nWinNodes += Vec_PtrSize(p->pWin->vNodes);
        p->nDivNodes += Vec_PtrSize( p->pWin->vDivs);

        if ( p->pPars->fVeryVerbose )
        {
            printf( "D = %3d ", Vec_PtrSize(p->pWin->vDivs) );
            printf( "D+ = %3d ", p->pWin->nDivsPlus );
        }

        // create the AIG for the window
clk = Abc_Clock();
        if ( p->pAig ) Abc_NtkDelete( p->pAig );
        p->pAig = Res_WndStrash( p->pWin );
p->timeAig += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
        {
            printf( "AIG = %4d ", Abc_NtkNodeNum(p->pAig) );
            printf( "\n" );
        }
 
        // prepare simulation info
clk = Abc_Clock();
        RetValue = Res_SimPrepare( p->pSim, p->pAig, Vec_PtrSize(p->pWin->vLeaves), 0 ); //p->pPars->fVerbose );
p->timeSim += Abc_Clock() - clk;
        if ( !RetValue )
        {
            p->nSimEmpty++;
            continue;
        }

        // consider the case of constant node
        if ( p->pSim->fConst0 || p->pSim->fConst1 )
        {
            p->nConstsUsed++;

            pFunc = p->pSim->fConst1? Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc) : Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
            vFanins = Vec_VecEntry( p->vResubsW, 0 );
            Vec_PtrClear( vFanins );
            Res_UpdateNetwork( pObj, vFanins, pFunc, p->vLevels );
            continue;
        }

//        printf( " " );

        // find resub candidates for the node
clk = Abc_Clock();
        if ( p->pPars->fArea )
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 1 );
        else
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 0 );
p->timeCand += Abc_Clock() - clk;
        p->nCandSets += RetValue;
        if ( RetValue == 0 )
            continue;

//        printf( "%d(%d) ", Vec_PtrSize(p->pWin->vDivs), RetValue );

        p->nWinsUsed++;

        // iterate through candidate resubstitutions
        Vec_VecForEachLevel( p->vResubs, vFanins, k )
        {
            if ( Vec_PtrSize(vFanins) == 0 )
                break;

            // solve the SAT problem and get clauses
clk = Abc_Clock();
            if ( p->pCnf ) Sto_ManFree( p->pCnf );
            p->pCnf = (Sto_Man_t *)Res_SatProveUnsat( p->pAig, vFanins );
            if ( p->pCnf == NULL )
            {
p->timeSatSat += Abc_Clock() - clk;
//                printf( " Sat\n" );
//                printf( "-" );
                continue;
            }
p->timeSatUnsat += Abc_Clock() - clk;
//            printf( "+" );

            p->nProvedSets++;
//            printf( " Unsat\n" );
//            continue;
//            printf( "Proved %d.\n", k );

            // write it into a file
//            Sto_ManDumpClauses( p->pCnf, "trace.cnf" );

            // interpolate the problem if it was UNSAT
clk = Abc_Clock();
            nFanins = Int_ManInterpolate( p->pMan, p->pCnf, 0, &puTruth );
p->timeInt += Abc_Clock() - clk;
            if ( nFanins != Vec_PtrSize(vFanins) - 2 )
                continue;
            assert( puTruth );
//            Extra_PrintBinary( stdout, puTruth, 1 << nFanins );  printf( "\n" );

            // transform interpolant into the AIG
            pGraph = Kit_TruthToGraph( puTruth, nFanins, p->vMem );

            // derive the AIG for the decomposition tree
            pFunc = Kit_GraphToHop( (Hop_Man_t *)pNtk->pManFunc, pGraph );
            Kit_GraphFree( pGraph );

            // update the network
clk = Abc_Clock();
            Res_UpdateNetwork( pObj, Vec_VecEntry(p->vResubsW, k), pFunc, p->vLevels );
p->timeUpd += Abc_Clock() - clk;
            break;
        }
//        printf( "\n" );
    }
    Extra_ProgressBarStop( pProgress );
    Abc_NtkStopReverseLevels( pNtk );

p->timeSatSim += p->pSim->timeSat;
p->timeSatTotal = p->timeSatSat + p->timeSatUnsat + p->timeSatSim;

    p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);

    // quit resubstitution manager
p->timeTotal = Abc_Clock() - clkTotal;
    Res_ManFree( p );

s_ResynTime += Abc_Clock() - clkTotal;
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Abc_NtkResynthesize(): Network check has failed.\n" );
        return 0;
    }
    return 1;
}